

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

pair<unsigned_long,_bool> __thiscall
cmComputeLinkDepends::AddLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item,size_t groupIndex)

{
  pointer this_00;
  _Base_ptr p_Var1;
  pointer pLVar2;
  size_type sVar3;
  bool bVar4;
  string *psVar5;
  cmValue cVar6;
  ulong uVar7;
  pointer pcVar8;
  string_view str;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_unsigned_long>_>,_bool> pVar9;
  pair<unsigned_long,_bool> pVar10;
  string_view prefix;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_a8;
  BFSEntry qe;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  BFSEntry qe_1;
  
  pVar9 = AllocateLinkEntry(this,item);
  p_Var1 = pVar9.first._M_node._M_node[4]._M_parent;
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar7 = 0;
    goto LAB_00518a8a;
  }
  pLVar2 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = pLVar2 + (long)p_Var1;
  psVar5 = cmLinkItem::AsStr_abi_cxx11_(item);
  std::__cxx11::string::string((string *)&local_68,(string *)psVar5);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_a8,
                 (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)&item->Backtrace);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )&qe,&local_68,(cmListFileBacktrace *)&local_a8);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
            (&this_00->Item,
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )&qe);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )&qe);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  std::__cxx11::string::~string((string *)&local_68);
  pLVar2 = pLVar2 + (long)p_Var1;
  psVar5 = &pLVar2->Feature;
  pLVar2->Target = item->Target;
  std::__cxx11::string::_M_assign((string *)psVar5);
  pcVar8 = (pLVar2->Item).Value._M_dataplus._M_p;
  if (((pLVar2->Target == (cmGeneratorTarget *)0x0) && (*pcVar8 == '-')) && (pcVar8[1] != 'l')) {
    std::__cxx11::string::substr((ulong)&qe,(ulong)this_00);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&qe
                            ,"-framework");
    std::__cxx11::string::~string((string *)&qe);
    if (!bVar4) {
      pcVar8 = (this_00->Item).Value._M_dataplus._M_p;
      goto LAB_0051898f;
    }
    this_00->Kind = Flag;
    std::__cxx11::string::_M_assign((string *)psVar5);
  }
  else {
LAB_0051898f:
    str._M_str = pcVar8;
    str._M_len = (this_00->Item).Value._M_string_length;
    prefix._M_str = DAT_00a40fc8;
    prefix._M_len = (anonymous_namespace)::LG_BEGIN;
    bVar4 = cmHasPrefix(str,prefix);
    if (((bVar4) && (sVar3 = (this_00->Item).Value._M_string_length, sVar3 != 0)) &&
       ((this_00->Item).Value._M_dataplus._M_p[sVar3 - 1] == '>')) {
      this_00->Kind = Group;
    }
  }
  uVar7 = CONCAT71((int7)((ulong)psVar5 >> 8),1);
  if (this_00->Kind != Group) {
    if (this_00->Target == (cmGeneratorTarget *)0x0) {
      cmStrCat<std::__cxx11::string&,char_const(&)[13]>
                ((string *)&qe,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (char (*) [13])"_LIB_DEPENDS");
      cVar6 = cmMakefile::GetDefinition(this->Makefile,(string *)&qe);
      if (cVar6.Value == (string *)0x0) {
        if (this_00->Kind != Flag) {
          (this->InferredDependSets).
          super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)p_Var1].Initialized = true;
        }
      }
      else {
        qe_1.LibDepends = ((cVar6.Value)->_M_dataplus)._M_p;
        qe_1.Index = (size_t)p_Var1;
        qe_1.GroupIndex = groupIndex;
        std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
        ::push_back(&(this->BFSQueue).c,&qe_1);
      }
      std::__cxx11::string::~string((string *)&qe);
    }
    else {
      qe.LibDepends = (char *)0x0;
      qe.Index = (size_t)p_Var1;
      qe.GroupIndex = groupIndex;
      std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>::
      push_back(&(this->BFSQueue).c,&qe);
    }
  }
LAB_00518a8a:
  pVar10._8_8_ = uVar7 & 0xffffffff;
  pVar10.first = (unsigned_long)p_Var1;
  return pVar10;
}

Assistant:

std::pair<size_t, bool> cmComputeLinkDepends::AddLinkEntry(
  cmLinkItem const& item, size_t groupIndex)
{
  // Allocate a spot for the item entry.
  auto lei = this->AllocateLinkEntry(item);

  // Check if the item entry has already been added.
  if (!lei.second) {
    // Yes.  We do not need to follow the item's dependencies again.
    return { lei.first->second, false };
  }

  // Initialize the item entry.
  size_t index = lei.first->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = BT<std::string>(item.AsStr(), item.Backtrace);
  entry.Target = item.Target;
  entry.Feature = item.Feature;
  if (!entry.Target && entry.Item.Value[0] == '-' &&
      entry.Item.Value[1] != 'l' &&
      entry.Item.Value.substr(0, 10) != "-framework") {
    entry.Kind = LinkEntry::Flag;
    entry.Feature = LinkEntry::DEFAULT;
  } else if (cmHasPrefix(entry.Item.Value, LG_BEGIN) &&
             cmHasSuffix(entry.Item.Value, '>')) {
    entry.Kind = LinkEntry::Group;
  }

  if (entry.Kind != LinkEntry::Group) {
    // If the item has dependencies queue it to follow them.
    if (entry.Target) {
      // Target dependencies are always known.  Follow them.
      BFSEntry qe = { index, groupIndex, nullptr };
      this->BFSQueue.push(qe);
    } else {
      // Look for an old-style <item>_LIB_DEPENDS variable.
      std::string var = cmStrCat(entry.Item.Value, "_LIB_DEPENDS");
      if (cmValue val = this->Makefile->GetDefinition(var)) {
        // The item dependencies are known.  Follow them.
        BFSEntry qe = { index, groupIndex, val->c_str() };
        this->BFSQueue.push(qe);
      } else if (entry.Kind != LinkEntry::Flag) {
        // The item dependencies are not known.  We need to infer them.
        this->InferredDependSets[index].Initialized = true;
      }
    }
  }

  return { index, true };
}